

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestServer.hpp
# Opt level: O0

void __thiscall test_server::TestServer::~TestServer(TestServer *this)

{
  pid_t pVar1;
  ostream *poVar2;
  pointer this_00;
  TestServer *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"terminating child ");
  this_00 = std::unique_ptr<boost::process::child,_std::default_delete<boost::process::child>_>::
            operator->(&this->child);
  pVar1 = boost::process::child::id(this_00);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pVar1);
  std::operator<<(poVar2,"\n");
  std::unique_ptr<boost::process::child,_std::default_delete<boost::process::child>_>::~unique_ptr
            (&this->child);
  return;
}

Assistant:

~TestServer() { std::cout << "terminating child " << child->id() << "\n"; }